

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000176590 = 0x2d2d2d2d2d2d2d;
    uRam0000000000176597 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00176580 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176588 = 0x2d2d2d2d2d2d2d;
    DAT_0017658f = 0x2d;
    _DAT_00176570 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176578 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00176560 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176568 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176558 = 0x2d2d2d2d2d2d2d2d;
    DAT_0017659f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }